

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  long *pInLimit;
  long *plVar1;
  long *plVar2;
  long *plVar3;
  undefined8 *puVar4;
  U32 hBits;
  BYTE *pBVar5;
  U32 *pUVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  uint uVar9;
  undefined8 uVar10;
  char cVar11;
  size_t sVar12;
  BYTE *pBVar13;
  long lVar14;
  size_t sVar15;
  byte bVar16;
  int iVar17;
  U32 UVar18;
  uint uVar19;
  long *plVar20;
  long *plVar21;
  int iVar22;
  long *plVar23;
  uint uVar24;
  ulong uVar25;
  BYTE *pBVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  U32 UVar31;
  BYTE *pBVar32;
  long *plVar33;
  long *plVar34;
  ulong uVar35;
  seqDef *psVar36;
  long *plVar37;
  long *plVar38;
  ulong uVar39;
  uint local_dc;
  BYTE *litLimit_w;
  
  pInLimit = (long *)((long)src + srcSize);
  pBVar5 = (ms->window).base;
  uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar22 = (int)pBVar5;
  iVar17 = (int)pInLimit - iVar22;
  uVar27 = (ms->window).lowLimit;
  uVar9 = uVar27;
  if (uVar30 < iVar17 - uVar27) {
    uVar9 = iVar17 - uVar30;
  }
  pUVar6 = ms->hashTable;
  if (ms->loadedDictEnd != 0) {
    uVar9 = uVar27;
  }
  pUVar7 = ms->chainTable;
  plVar3 = (long *)((long)src + (srcSize - 8));
  hBits = (ms->cParams).chainLog;
  uVar27 = (ms->window).dictLimit;
  uVar28 = *rep;
  uVar24 = rep[1];
  cVar11 = (char)(ms->cParams).hashLog;
  local_dc = uVar24;
  if (uVar9 < uVar27) {
    pBVar8 = (ms->window).dictBase;
    plVar38 = (long *)(pBVar5 + uVar27);
    plVar1 = (long *)(pBVar8 + uVar9);
    plVar20 = (long *)(pBVar8 + uVar27);
    bVar16 = 0x40 - cVar11;
    plVar2 = pInLimit + -4;
    plVar21 = (long *)src;
LAB_00143b82:
    do {
      if (plVar3 <= src) {
        *rep = uVar28;
        src = plVar21;
LAB_00144e05:
        rep[1] = local_dc;
        return (long)pInLimit - (long)src;
      }
      sVar12 = ZSTD_hashPtr(src,hBits,mls);
      uVar30 = pUVar7[sVar12];
      pBVar26 = pBVar8;
      if (uVar27 <= uVar30) {
        pBVar26 = pBVar5;
      }
      lVar14 = *src;
      uVar25 = (ulong)(lVar14 * -0x30e44323485a9b9d) >> (bVar16 & 0x3f);
      uVar24 = pUVar6[uVar25];
      pBVar32 = pBVar8;
      if (uVar27 <= uVar24) {
        pBVar32 = pBVar5;
      }
      UVar31 = (int)src - iVar22;
      UVar18 = UVar31 + 1;
      uVar19 = UVar18 - uVar28;
      pUVar6[uVar25] = UVar31;
      pUVar7[sVar12] = UVar31;
      if ((uVar9 < uVar19) && (2 < (uVar27 - 1) - uVar19)) {
        pBVar13 = pBVar8;
        if (uVar27 <= uVar19) {
          pBVar13 = pBVar5;
        }
        if (*(int *)(pBVar13 + uVar19) != *(int *)((long)src + 1)) goto LAB_00143c53;
        plVar23 = pInLimit;
        if (uVar19 < uVar27) {
          plVar23 = plVar20;
        }
        sVar12 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 5),pBVar13 + (ulong)uVar19 + 4,(BYTE *)pInLimit,
                            (BYTE *)plVar23,(BYTE *)plVar38);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00144e22;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00144e41;
        plVar23 = (long *)((long)src + 1);
        uVar25 = (long)plVar23 - (long)plVar21;
        plVar33 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + uVar25))
        goto LAB_00144e60;
        if (pInLimit < plVar23) goto LAB_00144e7f;
        if (plVar2 < plVar23) {
          ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)plVar21,(BYTE *)plVar23,(BYTE *)plVar2);
LAB_00143d3f:
          seqStore->lit = seqStore->lit + uVar25;
          if (0xffff < uVar25) {
            if (seqStore->longLengthID != 0) goto LAB_00144ebd;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar14 = plVar21[1];
          *plVar33 = *plVar21;
          plVar33[1] = lVar14;
          pBVar26 = seqStore->lit;
          if (0x10 < uVar25) {
            lVar14 = (long)(pBVar26 + 0x10) - (long)(plVar21 + 2);
            if (lVar14 < 8) {
              if (-0x10 < lVar14) goto LAB_00144edc;
            }
            else if (0xffffffffffffffe0 < lVar14 - 0x10U) goto LAB_00144efb;
            lVar14 = plVar21[3];
            *(long *)(pBVar26 + 0x10) = plVar21[2];
            *(long *)(pBVar26 + 0x18) = lVar14;
            if (0x20 < (long)uVar25) {
              lVar14 = 0;
              do {
                puVar4 = (undefined8 *)((long)plVar21 + lVar14 + 0x20);
                uVar10 = puVar4[1];
                pBVar32 = pBVar26 + lVar14 + 0x20;
                *(undefined8 *)pBVar32 = *puVar4;
                *(undefined8 *)(pBVar32 + 8) = uVar10;
                puVar4 = (undefined8 *)((long)plVar21 + lVar14 + 0x30);
                uVar10 = puVar4[1];
                *(undefined8 *)(pBVar32 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar32 + 0x18) = uVar10;
                lVar14 = lVar14 + 0x20;
              } while (pBVar32 + 0x20 < pBVar26 + uVar25);
            }
            goto LAB_00143d3f;
          }
          seqStore->lit = pBVar26 + uVar25;
        }
        lVar14 = sVar12 + 4;
        uVar35 = sVar12 + 1;
        psVar36 = seqStore->sequences;
        psVar36->litLength = (U16)uVar25;
        psVar36->offset = 1;
        uVar24 = uVar28;
        if (uVar35 < 0x10000) goto LAB_00144277;
        if (seqStore->longLengthID != 0) goto LAB_00144e9e;
LAB_00144258:
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
      }
      else {
LAB_00143c53:
        if ((uVar9 < uVar24) && (plVar33 = (long *)(pBVar32 + uVar24), *plVar33 == lVar14)) {
          plVar34 = plVar38;
          plVar23 = pInLimit;
          if (uVar24 < uVar27) {
            plVar34 = plVar1;
            plVar23 = plVar20;
          }
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 8),(BYTE *)(plVar33 + 1),(BYTE *)pInLimit,
                              (BYTE *)plVar23,(BYTE *)plVar38);
          uVar24 = UVar31 - uVar24;
          for (lVar29 = 0;
              ((plVar23 = (long *)((long)src + lVar29), plVar34 < (long *)((long)plVar33 + lVar29)
               && (plVar21 < plVar23)) &&
              (*(BYTE *)((long)src + lVar29 + -1) == *(BYTE *)((long)plVar33 + lVar29 + -1)));
              lVar29 = lVar29 + -1) {
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00144e22;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00144e41;
          plVar33 = (long *)seqStore->lit;
          pBVar26 = (BYTE *)((long)src + (lVar29 - (long)plVar21));
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + (long)pBVar26))
          goto LAB_00144e60;
          if (pInLimit < plVar23) goto LAB_00144e7f;
          uVar25 = (long)plVar23 - (long)plVar21;
          if (plVar2 < plVar23) {
            ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)plVar21,(BYTE *)plVar23,(BYTE *)plVar2);
LAB_00143e72:
            seqStore->lit = seqStore->lit + (long)((long)src + (lVar29 - (long)plVar21));
            if (0xffff < uVar25) {
              if (seqStore->longLengthID != 0) goto LAB_00144ebd;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar14 = plVar21[1];
            *plVar33 = *plVar21;
            plVar33[1] = lVar14;
            pBVar32 = seqStore->lit;
            if (0x10 < uVar25) {
              lVar14 = (long)(pBVar32 + 0x10) - (long)(plVar21 + 2);
              if (lVar14 < 8) {
                if (-0x10 < lVar14) goto LAB_00144edc;
              }
              else if (0xffffffffffffffe0 < lVar14 - 0x10U) goto LAB_00144efb;
              lVar14 = plVar21[3];
              *(long *)(pBVar32 + 0x10) = plVar21[2];
              *(long *)(pBVar32 + 0x18) = lVar14;
              if (0x20 < (long)uVar25) {
                lVar14 = 0;
                do {
                  puVar4 = (undefined8 *)((long)plVar21 + lVar14 + 0x20);
                  uVar10 = puVar4[1];
                  pBVar13 = pBVar32 + lVar14 + 0x20;
                  *(undefined8 *)pBVar13 = *puVar4;
                  *(undefined8 *)(pBVar13 + 8) = uVar10;
                  puVar4 = (undefined8 *)((long)plVar21 + lVar14 + 0x30);
                  uVar10 = puVar4[1];
                  *(undefined8 *)(pBVar13 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar13 + 0x18) = uVar10;
                  lVar14 = lVar14 + 0x20;
                } while (pBVar13 + 0x20 < pBVar32 + (long)pBVar26);
              }
              goto LAB_00143e72;
            }
            seqStore->lit = pBVar32 + (long)pBVar26;
          }
          uVar35 = (sVar12 - lVar29) + 5;
          lVar14 = (sVar12 - lVar29) + 8;
          psVar36 = seqStore->sequences;
          psVar36->litLength = (short)lVar29 + ((short)src - (short)plVar21);
          psVar36->offset = uVar24 + 3;
          local_dc = uVar28;
          if (0xffff < uVar35) {
            UVar18 = seqStore->longLengthID;
            goto joined_r0x00144119;
          }
        }
        else {
          if ((uVar30 <= uVar9) ||
             (plVar33 = (long *)(pBVar26 + uVar30), (int)*plVar33 != (int)*src)) {
            src = (void *)((long)src + ((long)src - (long)plVar21 >> 8) + 1);
            goto LAB_00143b82;
          }
          lVar14 = *(long *)((long)src + 1);
          uVar25 = (ulong)(lVar14 * -0x30e44323485a9b9d) >> (bVar16 & 0x3f);
          uVar24 = pUVar6[uVar25];
          pBVar26 = pBVar5;
          if (uVar24 < uVar27) {
            pBVar26 = pBVar8;
          }
          pUVar6[uVar25] = UVar18;
          if ((uVar9 < uVar24) && (plVar34 = (long *)(pBVar26 + uVar24), *plVar34 == lVar14)) {
            plVar23 = (long *)((long)src + 1);
            plVar37 = plVar38;
            plVar33 = pInLimit;
            if (uVar24 < uVar27) {
              plVar37 = plVar1;
              plVar33 = plVar20;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 9),(BYTE *)(plVar34 + 1),(BYTE *)pInLimit,
                                (BYTE *)plVar33,(BYTE *)plVar38);
            lVar14 = sVar12 + 8;
            uVar24 = UVar18 - uVar24;
            for (; ((plVar37 < plVar34 && (plVar21 < plVar23)) &&
                   (*(BYTE *)((long)plVar23 + -1) == *(BYTE *)((long)plVar34 + -1)));
                plVar23 = (long *)((long)plVar23 + -1)) {
              plVar34 = (long *)((long)plVar34 + -1);
              lVar14 = lVar14 + 1;
            }
          }
          else {
            plVar34 = plVar38;
            plVar23 = pInLimit;
            if (uVar30 < uVar27) {
              plVar34 = plVar1;
              plVar23 = plVar20;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)plVar33 + 4),(BYTE *)pInLimit
                                ,(BYTE *)plVar23,(BYTE *)plVar38);
            lVar14 = sVar12 + 4;
            uVar24 = UVar31 - uVar30;
            for (; ((plVar23 = (long *)src, plVar34 < plVar33 && (plVar21 < src)) &&
                   (*(BYTE *)((long)src + -1) == *(BYTE *)((long)plVar33 + -1)));
                src = (void *)((long)src + -1)) {
              plVar33 = (long *)((long)plVar33 + -1);
              lVar14 = lVar14 + 1;
            }
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00144e22;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00144e41;
          uVar25 = (long)plVar23 - (long)plVar21;
          plVar33 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + uVar25))
          goto LAB_00144e60;
          if (pInLimit < plVar23) goto LAB_00144e7f;
          if (plVar2 < plVar23) {
            ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)plVar21,(BYTE *)plVar23,(BYTE *)plVar2);
LAB_001441a6:
            seqStore->lit = seqStore->lit + uVar25;
            if (0xffff < uVar25) {
              if (seqStore->longLengthID != 0) goto LAB_00144ebd;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = plVar21[1];
            *plVar33 = *plVar21;
            plVar33[1] = lVar29;
            pBVar26 = seqStore->lit;
            if (0x10 < uVar25) {
              lVar29 = (long)(pBVar26 + 0x10) - (long)(plVar21 + 2);
              if (lVar29 < 8) {
                if (-0x10 < lVar29) goto LAB_00144edc;
              }
              else if (0xffffffffffffffe0 < lVar29 - 0x10U) goto LAB_00144efb;
              lVar29 = plVar21[3];
              *(long *)(pBVar26 + 0x10) = plVar21[2];
              *(long *)(pBVar26 + 0x18) = lVar29;
              if (0x20 < (long)uVar25) {
                lVar29 = 0;
                do {
                  puVar4 = (undefined8 *)((long)plVar21 + lVar29 + 0x20);
                  uVar10 = puVar4[1];
                  pBVar32 = pBVar26 + lVar29 + 0x20;
                  *(undefined8 *)pBVar32 = *puVar4;
                  *(undefined8 *)(pBVar32 + 8) = uVar10;
                  puVar4 = (undefined8 *)((long)plVar21 + lVar29 + 0x30);
                  uVar10 = puVar4[1];
                  *(undefined8 *)(pBVar32 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar32 + 0x18) = uVar10;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar32 + 0x20 < pBVar26 + uVar25);
              }
              goto LAB_001441a6;
            }
            seqStore->lit = pBVar26 + uVar25;
          }
          uVar35 = lVar14 - 3;
          psVar36 = seqStore->sequences;
          psVar36->litLength = (U16)uVar25;
          psVar36->offset = uVar24 + 3;
          local_dc = uVar28;
          if (0xffff < uVar35) {
            UVar18 = seqStore->longLengthID;
joined_r0x00144119:
            local_dc = uVar28;
            if (UVar18 == 0) goto LAB_00144258;
            goto LAB_00144e9e;
          }
        }
      }
LAB_00144277:
      src = (void *)(lVar14 + (long)plVar23);
      psVar36->matchLength = (U16)uVar35;
      psVar36 = psVar36 + 1;
      seqStore->sequences = psVar36;
      plVar21 = (long *)src;
      uVar28 = uVar24;
      if (src <= plVar3) {
        uVar30 = UVar31 + 2;
        pUVar6[(ulong)(*(long *)(pBVar5 + uVar30) * -0x30e44323485a9b9d) >> (bVar16 & 0x3f)] =
             uVar30;
        pUVar6[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar16 & 0x3f)] =
             ((int)src + -2) - iVar22;
        sVar12 = ZSTD_hashPtr(pBVar5 + uVar30,hBits,mls);
        pUVar7[sVar12] = uVar30;
        sVar12 = ZSTD_hashPtr((BYTE *)((long)src + -1),hBits,mls);
        pUVar7[sVar12] = (int)(BYTE *)((long)src + -1) - iVar22;
        for (; uVar28 = uVar24, plVar21 = (long *)src, src <= plVar3;
            src = (void *)((long)src + sVar12 + 4)) {
          UVar18 = (int)src - iVar22;
          uVar30 = UVar18 - local_dc;
          pBVar26 = pBVar5;
          if (uVar30 < uVar27) {
            pBVar26 = pBVar8;
          }
          if (((uVar30 <= uVar9) || ((uVar27 - 1) - uVar30 < 3)) ||
             (*(int *)(pBVar26 + uVar30) != (int)*src)) break;
          plVar21 = pInLimit;
          if (uVar30 < uVar27) {
            plVar21 = plVar20;
          }
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar26 + uVar30) + 4),
                              (BYTE *)pInLimit,(BYTE *)plVar21,(BYTE *)plVar38);
          if (seqStore->maxNbSeq <= (ulong)((long)psVar36 - (long)seqStore->sequencesStart >> 3))
          goto LAB_00144e22;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00144e41;
          plVar21 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < plVar21) goto LAB_00144e60;
          if (pInLimit < src) goto LAB_00144e7f;
          if (plVar2 < src) {
            ZSTD_safecopyLiterals((BYTE *)plVar21,(BYTE *)src,(BYTE *)src,(BYTE *)plVar2);
          }
          else {
            lVar14 = *(long *)((long)src + 8);
            *plVar21 = *src;
            plVar21[1] = lVar14;
          }
          psVar36 = seqStore->sequences;
          psVar36->litLength = 0;
          psVar36->offset = 1;
          if (0xffff < sVar12 + 1) {
            if (seqStore->longLengthID != 0) goto LAB_00144e9e;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar36->matchLength = (U16)(sVar12 + 1);
          psVar36 = psVar36 + 1;
          seqStore->sequences = psVar36;
          sVar15 = ZSTD_hashPtr(src,hBits,mls);
          pUVar7[sVar15] = UVar18;
          pUVar6[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar16 & 0x3f)] = UVar18;
          uVar24 = local_dc;
          local_dc = uVar28;
        }
      }
    } while( true );
  }
  uVar9 = iVar17 - uVar30;
  if (iVar17 - uVar27 <= uVar30) {
    uVar9 = uVar27;
  }
  plVar2 = (long *)(pBVar5 + uVar9);
  plVar38 = (long *)((ulong)((int)src == (int)plVar2) + (long)src);
  uVar30 = (int)plVar38 - (int)plVar2;
  uVar27 = 0;
  if (uVar30 < uVar24) {
    local_dc = 0;
    uVar27 = uVar24;
  }
  if (uVar30 < uVar28) {
    uVar27 = uVar28;
  }
  uVar25 = (ulong)uVar28;
  if (uVar30 < uVar28) {
    uVar25 = 0;
  }
  bVar16 = 0x40 - cVar11;
  plVar1 = pInLimit + -4;
LAB_0014462c:
  uVar30 = (uint)uVar25;
  while( true ) {
    if (plVar3 <= plVar38) {
      if (uVar30 == 0) {
        uVar30 = uVar27;
      }
      *rep = uVar30;
      if (local_dc == 0) {
        local_dc = uVar27;
      }
      goto LAB_00144e05;
    }
    lVar14 = *plVar38;
    uVar35 = (ulong)(lVar14 * -0x30e44323485a9b9d) >> (bVar16 & 0x3f);
    sVar12 = ZSTD_hashPtr(plVar38,hBits,mls);
    UVar18 = (int)plVar38 - iVar22;
    uVar28 = pUVar6[uVar35];
    uVar24 = pUVar7[sVar12];
    plVar21 = (long *)((long)plVar38 + 1);
    pUVar7[sVar12] = UVar18;
    pUVar6[uVar35] = UVar18;
    if ((uVar30 != 0) && (*(int *)((long)plVar38 + -uVar25 + 1) == *(int *)((long)plVar38 + 1)))
    break;
    if ((uVar9 < uVar28) && (plVar20 = (long *)(pBVar5 + uVar28), *plVar20 == lVar14)) {
      sVar12 = ZSTD_count((BYTE *)(plVar38 + 1),(BYTE *)(plVar20 + 1),(BYTE *)pInLimit);
      lVar14 = sVar12 + 8;
      uVar25 = (long)plVar38 - (long)plVar20;
      for (plVar21 = plVar38;
          ((plVar2 < plVar20 && (src < plVar21)) &&
          (*(BYTE *)((long)plVar21 + -1) == *(BYTE *)((long)plVar20 + -1)));
          plVar21 = (long *)((long)plVar21 + -1)) {
        plVar20 = (long *)((long)plVar20 + -1);
        lVar14 = lVar14 + 1;
      }
      goto LAB_0014497a;
    }
    if ((uVar9 < uVar24) && (plVar20 = (long *)(pBVar5 + uVar24), (int)*plVar20 == (int)*plVar38))
    goto LAB_00144884;
    plVar38 = (long *)((long)plVar38 + ((long)plVar38 - (long)src >> 8) + 1);
  }
  sVar12 = ZSTD_count((BYTE *)((long)plVar38 + 5),(BYTE *)((long)plVar38 + -uVar25 + 5),
                      (BYTE *)pInLimit);
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00144e22;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00144e41;
  uVar35 = (long)plVar21 - (long)src;
  plVar38 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar38 + uVar35)) goto LAB_00144e60;
  if (pInLimit < plVar21) goto LAB_00144e7f;
  if (plVar1 < plVar21) {
    ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)src,(BYTE *)plVar21,(BYTE *)plVar1);
    goto LAB_0014479c;
  }
  lVar14 = *(long *)((long)src + 8);
  *plVar38 = *src;
  plVar38[1] = lVar14;
  pBVar8 = seqStore->lit;
  if (uVar35 < 0x11) {
    seqStore->lit = pBVar8 + uVar35;
    goto LAB_00144a73;
  }
  lVar14 = (long)(pBVar8 + 0x10) - ((long)src + 0x10);
  if (lVar14 < 8) {
    if (-0x10 < lVar14) goto LAB_00144edc;
  }
  else if (0xffffffffffffffe0 < lVar14 - 0x10U) goto LAB_00144efb;
  lVar14 = *(long *)((long)src + 0x18);
  *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
  *(long *)(pBVar8 + 0x18) = lVar14;
  if (0x20 < (long)uVar35) {
    lVar14 = 0;
    do {
      puVar4 = (undefined8 *)((long)src + lVar14 + 0x20);
      uVar10 = puVar4[1];
      pBVar26 = pBVar8 + lVar14 + 0x20;
      *(undefined8 *)pBVar26 = *puVar4;
      *(undefined8 *)(pBVar26 + 8) = uVar10;
      puVar4 = (undefined8 *)((long)src + lVar14 + 0x30);
      uVar10 = puVar4[1];
      *(undefined8 *)(pBVar26 + 0x10) = *puVar4;
      *(undefined8 *)(pBVar26 + 0x18) = uVar10;
      lVar14 = lVar14 + 0x20;
    } while (pBVar26 + 0x20 < pBVar8 + uVar35);
  }
LAB_0014479c:
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthID != 0) goto LAB_00144ebd;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00144a73:
  lVar14 = sVar12 + 4;
  uVar39 = sVar12 + 1;
  psVar36 = seqStore->sequences;
  psVar36->litLength = (U16)uVar35;
  psVar36->offset = 1;
  if (uVar39 < 0x10000) goto LAB_00144af9;
  if (seqStore->longLengthID == 0) goto LAB_00144ad9;
LAB_00144e9e:
  __assert_fail("seqStorePtr->longLengthID == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2058,
                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)")
  ;
LAB_00144884:
  lVar14 = *plVar21;
  uVar25 = (ulong)(lVar14 * -0x30e44323485a9b9d) >> (bVar16 & 0x3f);
  uVar28 = pUVar6[uVar25];
  pUVar6[uVar25] = UVar18 + 1;
  if ((uVar9 < uVar28) && (plVar23 = (long *)(pBVar5 + uVar28), *plVar23 == lVar14)) {
    sVar12 = ZSTD_count((BYTE *)((long)plVar38 + 9),(BYTE *)(plVar23 + 1),(BYTE *)pInLimit);
    lVar14 = sVar12 + 8;
    uVar25 = (long)plVar21 - (long)plVar23;
    for (; ((plVar2 < plVar23 && (src < plVar21)) &&
           (*(BYTE *)((long)plVar21 + -1) == *(BYTE *)((long)plVar23 + -1)));
        plVar21 = (long *)((long)plVar21 + -1)) {
      plVar23 = (long *)((long)plVar23 + -1);
      lVar14 = lVar14 + 1;
    }
  }
  else {
    sVar12 = ZSTD_count((BYTE *)((long)plVar38 + 4),(BYTE *)((long)plVar20 + 4),(BYTE *)pInLimit);
    lVar14 = sVar12 + 4;
    uVar25 = (long)plVar38 - (long)plVar20;
    for (plVar21 = plVar38;
        ((plVar2 < plVar20 && (src < plVar21)) &&
        (*(BYTE *)((long)plVar21 + -1) == *(BYTE *)((long)plVar20 + -1)));
        plVar21 = (long *)((long)plVar21 + -1)) {
      plVar20 = (long *)((long)plVar20 + -1);
      lVar14 = lVar14 + 1;
    }
  }
LAB_0014497a:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_00144e22:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2038,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_00144e41:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203a,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar35 = (long)plVar21 - (long)src;
  plVar38 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar38 + uVar35)) {
LAB_00144e60:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (pInLimit < plVar21) {
LAB_00144e7f:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203c,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (plVar1 < plVar21) {
    ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)src,(BYTE *)plVar21,(BYTE *)plVar1);
  }
  else {
    lVar29 = *(long *)((long)src + 8);
    *plVar38 = *src;
    plVar38[1] = lVar29;
    pBVar8 = seqStore->lit;
    if (uVar35 < 0x11) {
      seqStore->lit = pBVar8 + uVar35;
      goto LAB_00144aa8;
    }
    lVar29 = (long)(pBVar8 + 0x10) - ((long)src + 0x10);
    if (lVar29 < 8) {
      if (-0x10 < lVar29) {
LAB_00144edc:
        __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1268,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
    }
    else if (0xffffffffffffffe0 < lVar29 - 0x10U) {
LAB_00144efb:
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1270,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    lVar29 = *(long *)((long)src + 0x18);
    *(long *)(pBVar8 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar8 + 0x18) = lVar29;
    if (0x20 < (long)uVar35) {
      lVar29 = 0;
      do {
        puVar4 = (undefined8 *)((long)src + lVar29 + 0x20);
        uVar10 = puVar4[1];
        pBVar26 = pBVar8 + lVar29 + 0x20;
        *(undefined8 *)pBVar26 = *puVar4;
        *(undefined8 *)(pBVar26 + 8) = uVar10;
        puVar4 = (undefined8 *)((long)src + lVar29 + 0x30);
        uVar10 = puVar4[1];
        *(undefined8 *)(pBVar26 + 0x10) = *puVar4;
        *(undefined8 *)(pBVar26 + 0x18) = uVar10;
        lVar29 = lVar29 + 0x20;
      } while (pBVar26 + 0x20 < pBVar8 + uVar35);
    }
  }
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthID != 0) {
LAB_00144ebd:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x204d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00144aa8:
  uVar39 = lVar14 - 3;
  psVar36 = seqStore->sequences;
  psVar36->litLength = (U16)uVar35;
  psVar36->offset = (int)uVar25 + 3;
  local_dc = uVar30;
  if (uVar39 < 0x10000) {
    uVar25 = uVar25 & 0xffffffff;
  }
  else {
    uVar25 = uVar25 & 0xffffffff;
    if (seqStore->longLengthID != 0) goto LAB_00144e9e;
LAB_00144ad9:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00144af9:
  src = (void *)(lVar14 + (long)plVar21);
  psVar36->matchLength = (U16)uVar39;
  psVar36 = psVar36 + 1;
  seqStore->sequences = psVar36;
  plVar38 = (long *)src;
  if (src <= plVar3) {
    uVar30 = UVar18 + 2;
    pUVar6[(ulong)(*(long *)(pBVar5 + uVar30) * -0x30e44323485a9b9d) >> (bVar16 & 0x3f)] = uVar30;
    pUVar6[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar16 & 0x3f)] =
         ((int)src + -2) - iVar22;
    sVar12 = ZSTD_hashPtr(pBVar5 + uVar30,hBits,mls);
    pUVar7[sVar12] = uVar30;
    sVar12 = ZSTD_hashPtr((BYTE *)((long)src + -1),hBits,mls);
    pUVar7[sVar12] = (int)(BYTE *)((long)src + -1) - iVar22;
    uVar28 = local_dc;
    uVar30 = (uint)uVar25;
    for (; local_dc = uVar28, uVar25 = (ulong)uVar30, plVar38 = (long *)src, src <= plVar3;
        src = (void *)((long)src + sVar12 + 4)) {
      if ((local_dc == 0) || ((int)*src != *(int *)((long)src - (ulong)local_dc))) break;
      sVar12 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_dc)),
                          (BYTE *)pInLimit);
      UVar18 = (int)src - iVar22;
      sVar15 = ZSTD_hashPtr(src,hBits,mls);
      pUVar7[sVar15] = UVar18;
      pUVar6[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar16 & 0x3f)] = UVar18;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar36 - (long)seqStore->sequencesStart >> 3))
      goto LAB_00144e22;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00144e41;
      plVar38 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar38) goto LAB_00144e60;
      if (pInLimit < src) goto LAB_00144e7f;
      if (plVar1 < src) {
        ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)src,(BYTE *)src,(BYTE *)plVar1);
      }
      else {
        lVar14 = *(long *)((long)src + 8);
        *plVar38 = *src;
        plVar38[1] = lVar14;
      }
      psVar36 = seqStore->sequences;
      psVar36->litLength = 0;
      psVar36->offset = 1;
      if (0xffff < sVar12 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00144e9e;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar36->matchLength = (U16)(sVar12 + 1);
      psVar36 = psVar36 + 1;
      seqStore->sequences = psVar36;
      uVar28 = uVar30;
      uVar30 = local_dc;
    }
  }
  goto LAB_0014462c;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, mls, ZSTD_noDict);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 current = (U32)(ip-base);
        const U32 repIndex = current + 1 - offset_1;   /* offset_1 expected <= current +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = current;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (repIndex > dictStartIndex))
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = current - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = current + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = current+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = current - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = current+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (repIndex2 > dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}